

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O2

bool check_range(int lower,int upper)

{
  AREA_DATA_conflict **ppAVar1;
  int cnt;
  
  cnt = 0;
  ppAVar1 = &area_first;
  do {
    ppAVar1 = &((AREA_DATA_conflict *)ppAVar1)->next->next;
    if ((AREA_DATA_conflict *)ppAVar1 == (AREA_DATA_conflict *)0x0) break;
    if ((lower <= ((AREA_DATA_conflict *)ppAVar1)->min_vnum &&
         ((AREA_DATA_conflict *)ppAVar1)->min_vnum <= upper) ||
       (((AREA_DATA_conflict *)ppAVar1)->max_vnum <= upper &&
        lower <= ((AREA_DATA_conflict *)ppAVar1)->max_vnum)) {
      cnt = cnt + 1;
    }
  } while (cnt < 2);
  return (AREA_DATA_conflict *)ppAVar1 == (AREA_DATA_conflict *)0x0;
}

Assistant:

bool check_range(int lower, int upper)
{
	AREA_DATA *pArea;
	int cnt = 0;

	for (pArea = area_first; pArea; pArea = pArea->next)
	{
		/*
		 * lower < area < upper
		 */
		if ((lower <= pArea->min_vnum && pArea->min_vnum <= upper)
			|| (lower <= pArea->max_vnum && pArea->max_vnum <= upper))
		{
			++cnt;
		}

		if (cnt > 1)
			return false;
	}

	return true;
}